

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

ARKodeMem arkCreate(SUNContext sunctx)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  SUNContext in_RDI;
  ARKodeMem ark_mem;
  int iret;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKODE","arkCreate","sunctx = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else {
    local_8 = (ARKodeMem)malloc(0x2a8);
    if (local_8 == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x14,"ARKode","arkCreate","Allocation of arkode_mem failed.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      memset(local_8,0,0x2a8);
      local_8->sunctx = in_RDI;
      local_8->uround = 2.220446049250313e-16;
      local_8->step_attachlinsol = (ARKTimestepAttachLinsolFn)0x0;
      local_8->step_attachmasssol = (ARKTimestepAttachMasssolFn)0x0;
      local_8->step_disablelsetup = (ARKTimestepDisableLSetup)0x0;
      local_8->step_disablemsetup = (ARKTimestepDisableMSetup)0x0;
      local_8->step_getlinmem = (ARKTimestepGetLinMemFn)0x0;
      local_8->step_getmassmem = (ARKTimestepGetMassMemFn)0x0;
      local_8->step_getimplicitrhs = (ARKTimestepGetImplicitRHSFn)0x0;
      local_8->step_mmult = (ARKMassMultFn)0x0;
      local_8->step_getgammas = (ARKTimestepGetGammasFn)0x0;
      local_8->step_init = (ARKTimestepInitFn)0x0;
      local_8->step_fullrhs = (ARKTimestepFullRHSFn)0x0;
      local_8->step = (ARKTimestepStepFn)0x0;
      local_8->step_mem = (void *)0x0;
      local_8->root_mem = (ARKodeRootMem)0x0;
      local_8->constraintsSet = 0;
      local_8->constraints = (N_Vector)0x0;
      local_8->report = 0;
      local_8->diagfp = (FILE *)0x0;
      local_8->lrw = 0x12;
      local_8->liw = 0x27;
      local_8->VabstolMallocDone = 0;
      local_8->VRabstolMallocDone = 0;
      local_8->MallocDone = 0;
      local_8->ProcessStep = (ARKPostProcessFn)0x0;
      local_8->ps_data = (void *)0x0;
      local_8->ProcessStage = (ARKPostProcessFn)0x0;
      local_8->user_data = (void *)0x0;
      pAVar2 = arkAdaptInit();
      local_8->hadapt_mem = pAVar2;
      if (local_8->hadapt_mem == (ARKodeHAdaptMem)0x0) {
        arkProcessError((ARKodeMem)0x0,-0x14,"ARKode","arkCreate",
                        "Allocation of step adaptivity structure failed");
        local_8 = (ARKodeMem)0x0;
      }
      else {
        local_8->lrw = local_8->lrw + 0x13;
        local_8->liw = local_8->liw + 8;
        local_8->interp = (ARKInterp)0x0;
        local_8->rwt_is_ewt = 1;
        local_8->call_fullrhs = 0;
        local_8->initsetup = 1;
        local_8->init_type = 0;
        local_8->firststage = 1;
        local_8->initialized = 0;
        local_8->h = 0.0;
        local_8->h0u = 0.0;
        iVar1 = arkSetDefaults(in_stack_ffffffffffffffd8);
        if (iVar1 != 0) {
          arkProcessError((ARKodeMem)0x0,0,"ARKode","arkCreate",
                          "Error setting default solver options");
          local_8 = (ARKodeMem)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeMem arkCreate(SUNContext sunctx)
{
  int iret;
  ARKodeMem ark_mem;

  if (!sunctx) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKODE", "arkCreate",
                    MSG_ARK_NULL_SUNCTX);
    return(NULL);
  }

  ark_mem = NULL;
  ark_mem = (ARKodeMem) malloc(sizeof(struct ARKodeMemRec));
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode", "arkCreate",
                    MSG_ARK_ARKMEM_FAIL);
    return(NULL);
  }

  /* Zero out ark_mem */
  memset(ark_mem, 0, sizeof(struct ARKodeMemRec));

  /* Set the context */
  ark_mem->sunctx = sunctx;

  /* Set uround */
  ark_mem->uround = UNIT_ROUNDOFF;

  /* Initialize time step module to NULL */
  ark_mem->step_attachlinsol   = NULL;
  ark_mem->step_attachmasssol  = NULL;
  ark_mem->step_disablelsetup  = NULL;
  ark_mem->step_disablemsetup  = NULL;
  ark_mem->step_getlinmem      = NULL;
  ark_mem->step_getmassmem     = NULL;
  ark_mem->step_getimplicitrhs = NULL;
  ark_mem->step_mmult          = NULL;
  ark_mem->step_getgammas      = NULL;
  ark_mem->step_init           = NULL;
  ark_mem->step_fullrhs        = NULL;
  ark_mem->step                = NULL;
  ark_mem->step_mem            = NULL;

  /* Initialize root finding variables */
  ark_mem->root_mem = NULL;

  /* Initialize inequality constraints variables */
  ark_mem->constraintsSet = SUNFALSE;
  ark_mem->constraints    = NULL;

  /* Initialize diagnostics reporting variables */
  ark_mem->report  = SUNFALSE;
  ark_mem->diagfp  = NULL;

  /* Initialize lrw and liw */
  ark_mem->lrw = 18;
  ark_mem->liw = 39;  /* fcn/data ptr, int, long int, sunindextype, booleantype */

  /* No mallocs have been done yet */
  ark_mem->VabstolMallocDone     = SUNFALSE;
  ark_mem->VRabstolMallocDone    = SUNFALSE;
  ark_mem->MallocDone            = SUNFALSE;

  /* No user-supplied step postprocessing function yet */
  ark_mem->ProcessStep  = NULL;
  ark_mem->ps_data      = NULL;

  /* No user-supplied stage postprocessing function yet */
  ark_mem->ProcessStage = NULL;

  /* No user_data pointer yet */
  ark_mem->user_data = NULL;

  /* Allocate step adaptivity structure and note storage */
  ark_mem->hadapt_mem = arkAdaptInit();
  if (ark_mem->hadapt_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode", "arkCreate",
                    "Allocation of step adaptivity structure failed");
    return(NULL);
  }
  ark_mem->lrw += ARK_ADAPT_LRW;
  ark_mem->liw += ARK_ADAPT_LIW;

  /* Initialize the interpolation structure to NULL */
  ark_mem->interp = NULL;

  /* Initially, rwt should point to ewt */
  ark_mem->rwt_is_ewt = SUNTRUE;

  /* Indicate that evaluation of the full RHS is not required after each step,
     this flag is updated to SUNTRUE by the interpolation module initialization
     function and/or the stepper initialization function in arkInitialSetup */
  ark_mem->call_fullrhs = SUNFALSE;

  /* Indicate that the problem needs to be initialized */
  ark_mem->initsetup   = SUNTRUE;
  ark_mem->init_type   = FIRST_INIT;
  ark_mem->firststage  = SUNTRUE;
  ark_mem->initialized = SUNFALSE;

  /* Initial step size has not been determined yet */
  ark_mem->h   = ZERO;
  ark_mem->h0u = ZERO;

  /* Set default values for integrator optional inputs */
  iret = arkSetDefaults(ark_mem);
  if (iret != ARK_SUCCESS) {
    arkProcessError(NULL, 0, "ARKode", "arkCreate",
                    "Error setting default solver options");
    return(NULL);
  }

  /* Return pointer to ARKode memory block */
  return(ark_mem);
}